

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdCelsiusLightModel::emulate_mthd(MthdCelsiusLightModel *this)

{
  uint uVar1;
  uint uVar2;
  
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
    uVar2 = (uVar1 & 3) << 0x13 |
            (uVar1 & 4) << 0x10 |
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a &
            0xffe3ffff;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a = uVar2;
    uVar1 = (uVar1 & 0x10000) << 0xc |
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b &
            0xefffffff;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b = uVar1;
    if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.debug_d & 0x10000000) == 0)
    {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] = uVar2;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] = uVar1;
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			insrt(exp.celsius_xf_misc_a, 18, 1, extr(val, 2, 1));
			insrt(exp.celsius_xf_misc_a, 19, 1, extr(val, 0, 1));
			insrt(exp.celsius_xf_misc_a, 20, 1, extr(val, 1, 1));
			insrt(exp.celsius_xf_misc_b, 28, 1, extr(val, 16, 1));
			if (!extr(exp.debug_d, 28, 1)) {
				exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
				exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
			}
		}
	}